

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O3

void __thiscall
chrono::utils::ChButterworth_Highpass::Config
          (ChButterworth_Highpass *this,uint nPoles,double step,double fc)

{
  vector<double,_std::allocator<double>_> *this_00;
  ulong uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  undefined1 auVar11 [16];
  uint uVar12;
  size_type __new_size;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined8 in_XMM2_Qb;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  this_00 = &this->m_Q;
  this->m_Ts = step;
  uVar14 = 1;
  if (1 < nPoles) {
    uVar14 = nPoles;
  }
  uVar15 = 6;
  if (uVar14 < 6) {
    uVar15 = (ulong)uVar14;
  }
  uVar14 = (uint)uVar15;
  __new_size = 0;
  if (1 < nPoles) {
    __new_size = uVar15 >> 1;
  }
  uVar12 = uVar14 & 1;
  if (nPoles < 2) {
    uVar12 = 1;
  }
  this->m_n_single = uVar12;
  this->m_n_biquad = (uint)__new_size;
  std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
  if (this->m_n_single == 1) {
    if (2 < nPoles) {
      uVar15 = 0;
      do {
        uVar13 = uVar15 + 1;
        auVar17._0_8_ = (double)(int)uVar13;
        auVar17._8_8_ = in_XMM2_Qb;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (double)(int)uVar14;
        auVar11 = vfmadd213sd_fma(auVar17,ZEXT816(0x4000000000000000),auVar3);
        dVar16 = cos(((auVar11._0_8_ + -1.0) * 3.141592653589793) / (double)(int)(uVar14 * 2));
        (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar15] = dVar16 * -2.0;
        uVar15 = uVar13;
      } while (uVar14 - 1 >> 1 != uVar13);
    }
  }
  else if (1 < nPoles) {
    uVar13 = (ulong)nPoles + (ulong)((ulong)nPoles == 0);
    uVar15 = 6;
    if (uVar13 < 6) {
      uVar15 = uVar13;
    }
    uVar13 = 0;
    do {
      uVar1 = uVar13 + 1;
      auVar18._0_8_ = (double)(int)uVar1;
      auVar18._8_8_ = in_XMM2_Qb;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = (double)(int)uVar14;
      auVar11 = vfmadd213sd_fma(auVar18,ZEXT816(0x4000000000000000),auVar11);
      dVar16 = cos(((auVar11._0_8_ + -1.0) * 3.141592653589793) / (double)(int)(uVar14 * 2));
      (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_start[uVar13] = dVar16 * -2.0;
      uVar13 = uVar1;
    } while ((uVar15 >> 1 & 0x7fffffff) != uVar1);
  }
  dVar16 = fc * 6.283185307179586;
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_a0,(ulong)this->m_n_biquad);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_a1,(ulong)this->m_n_biquad);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_a2,(ulong)this->m_n_biquad);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_b0,(ulong)this->m_n_biquad);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_b1,(ulong)this->m_n_biquad);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_b2,(ulong)this->m_n_biquad);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar16;
  if (this->m_n_single == 1) {
    auVar19._8_8_ = 0;
    auVar19._0_8_ = this->m_Ts;
    auVar11 = vfmadd231sd_fma(ZEXT816(0x4000000000000000),auVar19,auVar27);
    auVar18 = vfmadd213sd_fma(auVar19,auVar27,ZEXT816(0xc000000000000000));
    dVar20 = auVar11._0_8_;
    auVar21._8_8_ = dVar20;
    auVar21._0_8_ = dVar20;
    auVar11 = vdivpd_avx(_DAT_009f3610,auVar21);
    this->m_b0 = (double)auVar11._0_8_;
    this->m_b1 = (double)auVar11._8_8_;
    this->m_a1 = auVar18._0_8_ / dVar20;
    this->m_a0 = 1.0;
  }
  uVar15 = (ulong)this->m_n_biquad;
  if (uVar15 != 0) {
    pdVar4 = (this->m_biq_b1).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->m_biq_b2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->m_biq_b0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->m_biq_a2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = 0;
    pdVar9 = (this->m_biq_a0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->m_biq_a1).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      pdVar7[uVar13] = 4.0;
      pdVar4[uVar13] = -8.0;
      pdVar5[uVar13] = 4.0;
      dVar20 = pdVar6[uVar13];
      dVar2 = this->m_Ts;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar16 * dVar2 * (dVar20 + dVar20);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar16 * dVar2 * dVar2;
      auVar11 = vfmadd231sd_fma(auVar22,auVar27,auVar25);
      pdVar9[uVar13] = auVar11._0_8_ + 4.0;
      dVar20 = this->m_Ts;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar16 * dVar20 * (dVar20 + dVar20);
      auVar11 = vfmadd213sd_fma(auVar23,auVar27,ZEXT816(0xc020000000000000));
      pdVar10[uVar13] = auVar11._0_8_;
      dVar20 = this->m_Ts;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar16 * dVar20 * pdVar6[uVar13] * -2.0;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar16 * dVar20 * dVar20;
      auVar11 = vfmadd231sd_fma(auVar24,auVar27,auVar26);
      pdVar8[uVar13] = auVar11._0_8_ + 4.0;
      pdVar7[uVar13] = pdVar7[uVar13] / pdVar9[uVar13];
      pdVar4[uVar13] = pdVar4[uVar13] / pdVar9[uVar13];
      pdVar5[uVar13] = pdVar5[uVar13] / pdVar9[uVar13];
      pdVar10[uVar13] = pdVar10[uVar13] / pdVar9[uVar13];
      pdVar8[uVar13] = pdVar8[uVar13] / pdVar9[uVar13];
      pdVar9[uVar13] = 1.0;
      uVar13 = uVar13 + 1;
    } while (uVar15 != uVar13);
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_u_hist1,uVar15);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_u_hist2,(ulong)this->m_n_biquad)
  ;
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_y_hist1,(ulong)this->m_n_biquad)
  ;
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_y_hist2,(ulong)this->m_n_biquad)
  ;
  Reset(this);
  return;
}

Assistant:

void ChButterworth_Highpass::Config(unsigned int nPoles, double step, double fc) {
    const unsigned int nPolesMin = 1;
    const unsigned int nPolesMax = 6;

    m_Ts = step;
    double wc = fc * CH_C_2PI;

    if (nPoles < nPolesMin) {
        nPoles = 1;
    }
    if (nPoles > nPolesMax) {
        nPoles = nPolesMax;
    }

    if (nPoles == 1) {
        m_n_single = 1;
        m_n_biquad = 0;
    } else {
        m_n_biquad = nPoles / 2;
        m_n_single = nPoles % 2;
    }
    m_Q.resize(m_n_biquad);
    if (m_n_single == 1) {
        for (unsigned int k = 1; k <= (nPoles - 1) / 2; k++) {
            m_Q[k - 1] = -2.0 * cos(CH_C_PI * (2.0 * k + nPoles - 1) / (2.0 * nPoles));
        }
    } else {
        for (unsigned int k = 1; k <= nPoles / 2; k++) {
            m_Q[k - 1] = -2.0 * cos(CH_C_PI * (2.0 * k + nPoles - 1) / (2.0 * nPoles));
        }
    }

    m_biq_a0.resize(m_n_biquad);
    m_biq_a1.resize(m_n_biquad);
    m_biq_a2.resize(m_n_biquad);
    m_biq_b0.resize(m_n_biquad);
    m_biq_b1.resize(m_n_biquad);
    m_biq_b2.resize(m_n_biquad);

    if (m_n_single == 1) {
        m_b0 = 2.0;
        m_b1 = -2.0;

        m_a0 = m_Ts * wc + 2.0;
        m_a1 = m_Ts * wc - 2.0;

        m_b0 /= m_a0;
        m_b1 /= m_a0;
        m_a1 /= m_a0;
        m_a0 = 1.0;
    }
    for (size_t i = 0; i < m_n_biquad; i++) {
        m_biq_b0[i] = 4.0;
        m_biq_b1[i] = -8.0;
        m_biq_b2[i] = 4.0;

        m_biq_a0[i] = m_Ts * m_Ts * wc * wc + 2.0 * m_Q[i] * m_Ts * wc + 4.0;
        m_biq_a1[i] = 2.0 * m_Ts * m_Ts * wc * wc - 8.0;
        m_biq_a2[i] = m_Ts * m_Ts * wc * wc - 2.0 * m_Q[i] * m_Ts * wc + 4.0;

        m_biq_b0[i] /= m_biq_a0[i];
        m_biq_b1[i] /= m_biq_a0[i];
        m_biq_b2[i] /= m_biq_a0[i];

        m_biq_a1[i] /= m_biq_a0[i];
        m_biq_a2[i] /= m_biq_a0[i];
        m_biq_a0[i] = 1.0;
    }
    m_biq_u_hist1.resize(m_n_biquad);
    m_biq_u_hist2.resize(m_n_biquad);
    m_biq_y_hist1.resize(m_n_biquad);
    m_biq_y_hist2.resize(m_n_biquad);

    Reset();
}